

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O0

void __thiscall GEO::Logger::~Logger(Logger *this)

{
  Logger *this_local;
  
  (this->super_Environment).super_Counted._vptr_Counted = (_func_int **)&PTR__Logger_002ba610;
  std::
  set<GEO::SmartPointer<GEO::LoggerClient>,_std::less<GEO::SmartPointer<GEO::LoggerClient>_>,_std::allocator<GEO::SmartPointer<GEO::LoggerClient>_>_>
  ::~set(&this->clients_);
  std::__cxx11::string::~string((string *)&this->current_feature_);
  std::__cxx11::string::~string((string *)&this->log_file_name_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->log_features_exclude_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set(&this->log_features_);
  LoggerStream::~LoggerStream(&this->status_);
  LoggerStream::~LoggerStream(&this->err_);
  LoggerStream::~LoggerStream(&this->warn_);
  LoggerStream::~LoggerStream(&this->out_);
  Environment::~Environment(&this->super_Environment);
  return;
}

Assistant:

Logger::~Logger() {
    }